

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O1

size_t xmi_process_EVNT(PBuffer *buffer,MidiFile *midi)

{
  byte bVar1;
  byte bVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  bool bVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  long lVar13;
  MidiNode node;
  MidiNode subnode;
  uint local_7c;
  value_type local_78;
  undefined7 local_58;
  undefined1 uStack_51;
  uint uStack_50;
  byte bStack_4c;
  byte bStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  MidiFile *local_38;
  
  bVar5 = Buffer::readable((buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (bVar5) {
    lVar13 = 0;
    local_7c = 0;
    local_38 = midi;
    do {
      peVar3 = (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pbVar6 = peVar3->read;
      bVar1 = *pbVar6;
      peVar3->read = pbVar6 + 1;
      if ((long)(char)bVar1 < 0) {
        local_78.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_78.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_78.time._0_7_ = (undefined7)lVar13;
        local_78.time._7_1_ = (undefined1)((ulong)lVar13 >> 0x38);
        uVar7 = local_7c + 1;
        uVar8 = bVar1 - 0x80 >> 4;
        local_78.index = local_7c;
        local_78.type = bVar1;
        if (uVar8 < 8) {
          if ((0x4fU >> (uVar8 & 0x1f) & 1) == 0) {
            if ((0x30U >> (uVar8 & 0x1f) & 1) == 0) {
              if (bVar1 == 0xff) {
                local_78.data1 = pbVar6[1];
                peVar3->read = pbVar6 + 2;
                local_78.data2 = pbVar6[2];
                peVar3->read = pbVar6 + 3;
                Buffer::pop((Buffer *)&local_58,(size_t)peVar3);
                this._M_pi = local_78.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
                local_78.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)CONCAT17(uStack_51,local_58);
                p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT17(uStack_49,
                                  CONCAT16(uStack_4a,
                                           CONCAT15(bStack_4b,CONCAT14(bStack_4c,uStack_50))));
                local_58 = 0;
                uStack_51 = 0;
                uStack_50 = 0;
                bStack_4c = 0;
                bStack_4b = 0;
                uStack_4a = 0;
                uStack_49 = 0;
                bVar5 = local_78.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_78.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = p_Var4;
                if (bVar5) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
                }
                p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT17(uStack_49,
                                  CONCAT16(uStack_4a,
                                           CONCAT15(bStack_4b,CONCAT14(bStack_4c,uStack_50))));
                if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                }
                if (((local_78.data1 == 0x51) && (midi->tempo == 0)) &&
                   (uVar8 = (uint)local_78.data2, local_78.data2 != 0)) {
                  uVar9 = midi->tempo;
                  pbVar6 = (local_78.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->read;
                  do {
                    midi->tempo = uVar9 << 8;
                    bVar1 = *pbVar6;
                    (local_78.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->read = pbVar6 + 1;
                    uVar9 = uVar9 << 8 | (uint)bVar1;
                    midi->tempo = uVar9;
                    uVar8 = uVar8 - 1;
                    pbVar6 = pbVar6 + 1;
                  } while (uVar8 != 0);
                }
              }
            }
            else {
              local_78.data1 = pbVar6[1];
              peVar3->read = pbVar6 + 2;
              local_78.data2 = 0;
            }
          }
          else {
            bVar2 = pbVar6[1];
            peVar3->read = pbVar6 + 2;
            local_78.data2 = pbVar6[2];
            peVar3->read = pbVar6 + 3;
            local_78.data1 = bVar2;
            if ((bVar1 & 0xf0) == 0x90) {
              std::vector<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>::
              push_back(&midi->nodes,&local_78);
              local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              peVar3 = (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              p_Var4 = (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                       _M_pi;
              if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                }
              }
              pbVar6 = peVar3->read;
              bVar12 = *pbVar6;
              peVar3->read = pbVar6 + 1;
              if ((char)bVar12 < '\0') {
                pbVar6 = pbVar6 + 2;
                uVar10 = 0;
                do {
                  uVar10 = (ulong)(bVar12 & 0x7f) | uVar10 << 7;
                  bVar12 = pbVar6[-1];
                  peVar3->read = pbVar6;
                  pbVar6 = pbVar6 + 1;
                } while ((char)bVar12 < '\0');
                lVar11 = uVar10 << 7;
              }
              else {
                lVar11 = 0;
              }
              bStack_4c = bVar1;
              if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
              }
              lVar11 = lVar11 + lVar13 + (ulong)bVar12;
              local_58 = (undefined7)lVar11;
              uStack_51 = (undefined1)((ulong)lVar11 >> 0x38);
              uStack_4a = 0;
              local_78.time._7_1_ = uStack_51;
              local_78.type = bStack_4c;
              local_78.data2 = 0;
              local_78.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_48._M_pi;
              local_78.time._0_7_ = local_58;
              local_78.index = uVar7;
              local_78.data1 = bVar2;
              uStack_50 = uVar7;
              bStack_4b = bVar2;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&local_78.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,&_Stack_40);
              if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
              }
              midi = local_38;
              uVar7 = local_7c + 2;
            }
          }
        }
        local_7c = uVar7;
        std::vector<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>::
        push_back(&midi->nodes,&local_78);
        if (local_78.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      else {
        lVar13 = lVar13 + (char)bVar1;
      }
      bVar5 = Buffer::readable((buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
    } while (bVar5);
  }
  return ((buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->size;
}

Assistant:

static size_t
xmi_process_EVNT(PBuffer buffer, MidiFile *midi) {
  uint64_t time = 0;
  unsigned int time_index = 0;

  while (buffer->readable()) {
    uint8_t type = buffer->pop<uint8_t>();

    if (type & 0x80) {
      ConvertorXMI2MID::MidiNode node;
      node.time = time;
      node.index = time_index++;
      node.type = type;

      switch (type & 0xF0) {
        case 0x80:
        case 0x90:
        case 0xA0:
        case 0xB0:
        case 0xE0:
          node.data1 = buffer->pop<uint8_t>();
          node.data2 = buffer->pop<uint8_t>();
          if ((type & 0xF0) == 0x90) {
            uint8_t data1 = node.data1;
            midi->nodes.push_back(node);

            ConvertorXMI2MID::MidiNode subnode;
            subnode.type = type;
            uint64_t length = midi_read_variable_size(buffer);

            // Generate on note with velocity zero corresponding to off note.
            subnode.time = time + length;
            subnode.index = time_index++;
            subnode.data1 = data1;
            subnode.data2 = 0;
            node = subnode;
          }
          break;
        case 0xC0:
        case 0xD0:
          node.data1 = buffer->pop<uint8_t>();
          node.data2 = 0;
          break;
        case 0xF0:
          if (type == 0xFF) {  // Meta message.
            node.data1 = buffer->pop<uint8_t>();
            node.data2 = buffer->pop<uint8_t>();
            node.buffer = buffer->pop(node.data2);
            if (node.data1 == 0x51) {
              if (midi->tempo == 0) {
                for (int i = 0; i < node.data2; i++) {
                  midi->tempo = midi->tempo << 8;
                  midi->tempo |= node.buffer->pop<uint8_t>();
                }
              }
            }
          }
          break;
      }

      midi->nodes.push_back(node);
    } else {
      time += type;
    }
  }

  return buffer->get_size();
}